

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cash.cpp
# Opt level: O2

void __thiscall Cash::save(Cash *this,ofstream *file)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  string sStack_58;
  string local_38;
  
  lVar1 = *(long *)file;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(file + lVar2 + 0x18) = *(uint *)(file + lVar2 + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(file + *(long *)(lVar1 + -0x18) + 8) = 2;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)file,(this->super_Transaction).id);
  poVar3 = std::operator<<(poVar3,",");
  Transaction::getSenderName_abi_cxx11_(&local_38,&this->super_Transaction);
  poVar3 = std::operator<<(poVar3,(string *)&local_38);
  poVar3 = std::operator<<(poVar3,",");
  Transaction::getReceiverName_abi_cxx11_(&sStack_58,&this->super_Transaction);
  poVar3 = std::operator<<(poVar3,(string *)&sStack_58);
  std::operator<<(poVar3,",");
  poVar3 = std::ostream::_M_insert<double>((this->super_Transaction).amount);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Cash::save(ofstream &file) const
{
    file << fixed << setprecision(2) << id << "," << Transaction::getSenderName() << "," << Transaction::getReceiverName() << "," << amount << endl;
}